

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

bool __thiscall
chaiscript::dispatch::Attribute_Access<int,_chaiscript::File_Position>::operator==
          (Attribute_Access<int,_chaiscript::File_Position> *this,Proxy_Function_Base *t_func)

{
  long in_RSI;
  long in_RDI;
  Attribute_Access<int,_chaiscript::File_Position> *aa;
  long local_38;
  bool local_1;
  
  if (in_RSI == 0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(in_RSI,&Proxy_Function_Base::typeinfo,
                              &Attribute_Access<int,chaiscript::File_Position>::typeinfo,0);
  }
  if (local_38 == 0) {
    local_1 = false;
  }
  else {
    local_1 = *(long *)(in_RDI + 0x28) == *(long *)(local_38 + 0x28);
  }
  return local_1;
}

Assistant:

virtual bool operator==(const Proxy_Function_Base &t_func) const CHAISCRIPT_OVERRIDE
        {
          const Attribute_Access<T, Class> * aa 
            = dynamic_cast<const Attribute_Access<T, Class> *>(&t_func);

          if (aa) {
            return m_attr == aa->m_attr;
          } else {
            return false;
          }
        }